

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::VariableSymbol*>::
emplaceRealloc<slang::ast::VariableSymbol*const&>
          (SmallVectorBase<slang::ast::VariableSymbol_*> *this,pointer pos,VariableSymbol **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator ppVVar4;
  long lVar5;
  pointer ppVVar6;
  EVP_PKEY_CTX *ctx;
  undefined8 *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::ast::VariableSymbol_*> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  VariableSymbol **in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = SmallVectorBase<slang::ast::VariableSymbol_*>::max_size
                    ((SmallVectorBase<slang::ast::VariableSymbol_*> *)0x4859fb);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = SmallVectorBase<slang::ast::VariableSymbol_*>::calculateGrowth
                    (in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  ppVVar4 = SmallVectorBase<slang::ast::VariableSymbol_*>::begin(in_RDI);
  lVar5 = (long)__last - (long)ppVVar4;
  ppVVar6 = (pointer)operator_new(0x485a5a);
  ppVVar6[lVar5 >> 3] = (VariableSymbol *)*in_RDX;
  ppVVar4 = SmallVectorBase<slang::ast::VariableSymbol_*>::end(in_RDI);
  if (in_RSI == ppVVar4) {
    ppVVar4 = SmallVectorBase<slang::ast::VariableSymbol_*>::begin(in_RDI);
    ctx = (EVP_PKEY_CTX *)SmallVectorBase<slang::ast::VariableSymbol_*>::end(in_RDI);
    std::uninitialized_move<slang::ast::VariableSymbol**,slang::ast::VariableSymbol**>
              (in_RSI,__last,ppVVar4);
  }
  else {
    SmallVectorBase<slang::ast::VariableSymbol_*>::begin(in_RDI);
    std::uninitialized_move<slang::ast::VariableSymbol**,slang::ast::VariableSymbol**>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    ctx = (EVP_PKEY_CTX *)SmallVectorBase<slang::ast::VariableSymbol_*>::end(in_RDI);
    std::uninitialized_move<slang::ast::VariableSymbol**,slang::ast::VariableSymbol**>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  SmallVectorBase<slang::ast::VariableSymbol_*>::cleanup(in_RDI,ctx);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = ppVVar6;
  return ppVVar6 + (lVar5 >> 3);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}